

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O1

void __thiscall libtorrent::aux::file_entry::file_entry(file_entry *this,file_entry *fe)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = *(ulong *)fe & 0xffffffffffff;
  uVar1 = (ulong)*(ushort *)&this->field_0x6 << 0x30;
  *(ulong *)this = uVar1 | uVar3;
  uVar2 = *(ulong *)fe;
  *(ulong *)this = uVar1 & 0x8000ffffffffffff | uVar3 | uVar2 & 0x7fff000000000000;
  *(ulong *)this = *(ulong *)fe & 0x8000000000000000 | uVar3 | uVar2 & 0x7fff000000000000;
  uVar2 = *(ulong *)&fe->field_0x8 & 0xffffffffffff;
  uVar1 = (ulong)*(ushort *)&this->field_0xe << 0x30;
  *(ulong *)&this->field_0x8 = uVar1 | uVar2;
  uVar6 = *(ulong *)&fe->field_0x8 & 0xfff000000000000;
  *(ulong *)&this->field_0x8 = uVar1 & 0xf000ffffffffffff | uVar2 | uVar6;
  uVar3 = *(ulong *)&fe->field_0x8 & 0x1000000000000000;
  *(ulong *)&this->field_0x8 = uVar1 & 0xe000ffffffffffff | uVar2 | uVar6 | uVar3;
  uVar4 = *(ulong *)&fe->field_0x8 & 0x2000000000000000;
  *(ulong *)&this->field_0x8 = uVar1 & 0xc000ffffffffffff | uVar2 | uVar6 | uVar3 | uVar4;
  uVar5 = *(ulong *)&fe->field_0x8 & 0x4000000000000000;
  *(ulong *)&this->field_0x8 = uVar1 & 0x8000ffffffffffff | uVar2 | uVar6 | uVar3 | uVar4 | uVar5;
  *(ulong *)&this->field_0x8 =
       uVar2 | uVar6 | uVar3 | uVar4 | uVar5 | *(ulong *)&fe->field_0x8 & 0x8000000000000000;
  this->name = fe->name;
  this->root = fe->root;
  (this->path_index).m_val = (fe->path_index).m_val;
  *(ushort *)&fe->field_0xe = *(ushort *)&fe->field_0xe & 0xf000;
  fe->name = (char *)0x0;
  return;
}

Assistant:

file_entry::file_entry(file_entry&& fe) noexcept
		: offset(fe.offset)
		, symlink_index(fe.symlink_index)
		, no_root_dir(fe.no_root_dir)
		, size(fe.size)
		, name_len(fe.name_len)
		, pad_file(fe.pad_file)
		, hidden_attribute(fe.hidden_attribute)
		, executable_attribute(fe.executable_attribute)
		, symlink_attribute(fe.symlink_attribute)
		, name(fe.name)
		, root(fe.root)
		, path_index(fe.path_index)
	{
		fe.name_len = 0;
		fe.name = nullptr;
	}